

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_fuzz.c
# Opt level: O0

int main(void)

{
  FILE *__stream;
  PaDeviceInfo *pPVar1;
  char *pcVar2;
  uint local_5c;
  PaStream *pPStack_58;
  PaError err;
  PaStream *stream;
  PaStreamParameters outputParameters;
  PaStreamParameters inputParameters;
  
  local_5c = Pa_Initialize();
  if (local_5c == 0) {
    outputParameters.hostApiSpecificStreamInfo._0_4_ = Pa_GetDefaultInputDevice();
    if ((PaDeviceIndex)outputParameters.hostApiSpecificStreamInfo == -1) {
      fprintf(_stderr,"Error: No default input device.\n");
    }
    else {
      outputParameters.hostApiSpecificStreamInfo._4_4_ = 2;
      Pa_GetDeviceInfo((PaDeviceIndex)outputParameters.hostApiSpecificStreamInfo);
      stream._0_4_ = Pa_GetDefaultOutputDevice();
      if ((PaDeviceIndex)stream == -1) {
        fprintf(_stderr,"Error: No default output device.\n");
      }
      else {
        stream._4_4_ = 2;
        outputParameters.device = 1;
        outputParameters.channelCount = 0;
        pPVar1 = Pa_GetDeviceInfo((PaDeviceIndex)stream);
        outputParameters.sampleFormat = (PaSampleFormat)pPVar1->defaultLowOutputLatency;
        outputParameters.suggestedLatency = 0.0;
        local_5c = Pa_OpenStream(&stack0xffffffffffffffa8,
                                 (PaStreamParameters *)&outputParameters.hostApiSpecificStreamInfo,
                                 (PaStreamParameters *)&stream,44100.0,0x40,0,fuzzCallback,
                                 (void *)0x0);
        if ((local_5c == 0) && (local_5c = Pa_StartStream(pPStack_58), local_5c == 0)) {
          printf("Hit ENTER to stop program.\n");
          getchar();
          local_5c = Pa_CloseStream(pPStack_58);
          if (local_5c == 0) {
            printf("Finished. gNumNoInputs = %d\n",(ulong)(uint)gNumNoInputs);
            Pa_Terminate();
            return 0;
          }
        }
      }
    }
  }
  Pa_Terminate();
  fprintf(_stderr,"An error occured while using the portaudio stream\n");
  fprintf(_stderr,"Error number: %d\n",(ulong)local_5c);
  __stream = _stderr;
  pcVar2 = Pa_GetErrorText(local_5c);
  fprintf(__stream,"Error message: %s\n",pcVar2);
  return -1;
}

Assistant:

int main(void)
{
    PaStreamParameters inputParameters, outputParameters;
    PaStream *stream;
    PaError err;

    err = Pa_Initialize();
    if( err != paNoError ) goto error;

    inputParameters.device = Pa_GetDefaultInputDevice(); /* default input device */
    if (inputParameters.device == paNoDevice) {
      fprintf(stderr,"Error: No default input device.\n");
      goto error;
    }
    inputParameters.channelCount = 2;       /* stereo input */
    inputParameters.sampleFormat = PA_SAMPLE_TYPE;
    inputParameters.suggestedLatency = Pa_GetDeviceInfo( inputParameters.device )->defaultLowInputLatency;
    inputParameters.hostApiSpecificStreamInfo = NULL;

    outputParameters.device = Pa_GetDefaultOutputDevice(); /* default output device */
    if (outputParameters.device == paNoDevice) {
      fprintf(stderr,"Error: No default output device.\n");
      goto error;
    }
    outputParameters.channelCount = 2;       /* stereo output */
    outputParameters.sampleFormat = PA_SAMPLE_TYPE;
    outputParameters.suggestedLatency = Pa_GetDeviceInfo( outputParameters.device )->defaultLowOutputLatency;
    outputParameters.hostApiSpecificStreamInfo = NULL;

    err = Pa_OpenStream(
              &stream,
              &inputParameters,
              &outputParameters,
              SAMPLE_RATE,
              FRAMES_PER_BUFFER,
              0, /* paClipOff, */  /* we won't output out of range samples so don't bother clipping them */
              fuzzCallback,
              NULL );
    if( err != paNoError ) goto error;

    err = Pa_StartStream( stream );
    if( err != paNoError ) goto error;

    printf("Hit ENTER to stop program.\n");
    getchar();
    err = Pa_CloseStream( stream );
    if( err != paNoError ) goto error;

    printf("Finished. gNumNoInputs = %d\n", gNumNoInputs );
    Pa_Terminate();
    return 0;

error:
    Pa_Terminate();
    fprintf( stderr, "An error occured while using the portaudio stream\n" );
    fprintf( stderr, "Error number: %d\n", err );
    fprintf( stderr, "Error message: %s\n", Pa_GetErrorText( err ) );
    return -1;
}